

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O1

void __thiscall TApp_ThrowingTransform_Test::TestBody(TApp_ThrowingTransform_Test *this)

{
  App *this_00;
  bool bVar1;
  Option *this_01;
  AssertionResult gtest_ar;
  string val;
  AssertHelper local_f0 [2];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0 [2];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [16];
  undefined1 local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  string local_70;
  string local_50;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"-m,--mess","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  this_00 = &(this->super_TApp).app;
  this_01 = CLI::App::
            add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                      (this_00,&local_50,&local_b8,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_80 = CLI::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp:1329:18)>
             ::_M_invoke;
  local_88 = CLI::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp:1329:18)>
             ::_M_manager;
  CLI::Option::transform
            (this_01,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                      *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
  }
  else {
    testing::Message::Message((Message *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              (local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x533,"Expected: run() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(local_f0,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper(local_f0);
    if (local_e0[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_e0[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_e0[0].ptr_ + 8))();
      }
      local_e0[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  CLI::App::reset(this_00);
  local_e0[0].ptr_ = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"-mone","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,local_e0,local_c0);
  if (local_e0[0].ptr_ != local_d0) {
    operator_delete(local_e0[0].ptr_);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_e0);
  testing::internal::AssertHelper::AssertHelper
            (local_f0,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x538,
             "Expected: run() throws an exception of type CLI::ValidationError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(local_f0,(Message *)local_e0);
  testing::internal::AssertHelper::~AssertHelper(local_f0);
  if (local_e0[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_e0[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_e0[0].ptr_ + 8))();
    }
    local_e0[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_F(TApp, ThrowingTransform) {
    std::string val;
    auto m = app.add_option("-m,--mess", val);
    m->transform([](std::string) -> std::string { throw CLI::ValidationError("My Message"); });

    EXPECT_NO_THROW(run());
    app.reset();

    args = {"-mone"};

    ASSERT_THROW(run(), CLI::ValidationError);

    app.reset();

    try {
        run();
    } catch(const CLI::ValidationError &e) {
        EXPECT_EQ(e.what(), std::string("--mess: My Message"));
    }
}